

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey
          (ExtPrivkey *this,NetType network_type,ByteData *parent_fingerprint,Privkey *privkey,
          ByteData256 *chain_code,uint8_t depth,uint32_t child_num)

{
  pointer puVar1;
  bool bVar2;
  value_type_conflict *__val;
  CfdException *pCVar3;
  uint32_t uVar4;
  string local_1f8;
  int ret;
  Privkey *local_1c8;
  ByteData256 *local_1c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b8;
  ByteData256 *local_198;
  ByteData256 *local_190;
  ByteData *local_188;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fingerprint_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chain_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_bytes;
  Pubkey pubkey;
  undefined1 local_f0 [32];
  undefined1 local_d0 [20];
  uint8_t local_bc;
  uchar local_b1;
  undefined1 local_b0 [32];
  uint32_t local_90;
  undefined1 local_8c [20];
  uint32_t local_78;
  undefined1 local_71 [65];
  
  local_190 = chain_code;
  local_188 = parent_fingerprint;
  ByteData::ByteData(&this->serialize_data_);
  this->child_num_ = 0;
  local_1c0 = &this->chaincode_;
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  ByteData256::ByteData256(local_1c0);
  local_1c8 = &this->privkey_;
  Privkey::Privkey(local_1c8);
  ByteData256::ByteData256(&this->tweak_sum_);
  local_198 = &this->tweak_sum_;
  bVar2 = Privkey::IsValid(privkey);
  if (!bVar2) {
    local_f0._0_8_ = "cfdcore_hdwallet.cpp";
    local_f0._8_4_ = 0x230;
    local_f0._16_8_ = (long)"kCfdExtPrivkey" + 4;
    logger::log<>((CfdSourceLocation *)local_f0,kCfdLogLevelWarning,"invalid privkey.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_f0._0_8_ = local_f0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Failed to privkey. ExtPrivkey invalid privkey.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f0);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  uVar4 = 0x4358394;
  if (network_type == kMainnet) {
    uVar4 = 0x488ade4;
  }
  if (network_type == kLiquidV1) {
    uVar4 = 0x488ade4;
  }
  memset(local_f0,0,0xc0);
  local_90 = child_num;
  local_bc = depth;
  local_78 = uVar4;
  Privkey::GeneratePubkey(&pubkey,privkey,true);
  Privkey::GetData((ByteData *)&local_1f8,privkey);
  ByteData::GetBytes(&privkey_bytes,(ByteData *)&local_1f8);
  if ((pointer)local_1f8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  Pubkey::GetData((ByteData *)&local_1f8,&pubkey);
  ByteData::GetBytes(&pubkey_bytes,(ByteData *)&local_1f8);
  if ((pointer)local_1f8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  HashUtil::Hash160((ByteData160 *)&local_1f8,&pubkey);
  ByteData160::GetBytes(&pubkey_hash,(ByteData160 *)&local_1f8);
  if ((pointer)local_1f8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  ByteData::GetBytes(&fingerprint_bytes,local_188);
  ByteData256::GetData((ByteData *)&local_1f8,local_190);
  ByteData::GetBytes(&chain_bytes,(ByteData *)&local_1f8);
  if ((pointer)local_1f8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  local_b1 = '\0';
  memcpy(local_b0,privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  memcpy(local_71,pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint_bytes,4);
  memcpy(local_d0,fingerprint_bytes.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,
         (long)fingerprint_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)fingerprint_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  memcpy(local_8c,pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start);
  memcpy(local_f0,chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start);
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x4e);
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x4e;
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3e] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3f] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x40] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x41] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x42] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x43] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x44] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x45] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x46] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x47] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x48] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x49] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x4a] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x4b] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x4c] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x4d] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x30] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x31] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x32] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x33] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x34] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x35] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x36] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x37] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x38] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x39] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3a] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3b] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3c] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3d] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3e] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3f] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x22] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x23] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x24] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x25] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x26] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x27] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x28] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x29] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2a] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2b] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2c] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2d] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2e] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2f] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ret = bip32_key_serialize((ext_key *)local_f0,0,
                            local_1b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,0x4e);
  if (ret == 0) {
    ByteData::ByteData((ByteData *)&local_1f8,&local_1b8);
    puVar1 = (this->serialize_data_).data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->serialize_data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_1f8._M_dataplus._M_p;
    (this->serialize_data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1f8._M_string_length;
    (this->serialize_data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_1f8.field_2._M_allocated_capacity;
    local_1f8._M_dataplus._M_p = (pointer)0x0;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_allocated_capacity = 0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      if ((pointer)local_1f8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
    }
    ByteData256::ByteData256((ByteData256 *)&local_1f8);
    puVar1 = (this->tweak_sum_).data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->tweak_sum_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_1f8._M_dataplus._M_p;
    (this->tweak_sum_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1f8._M_string_length;
    (this->tweak_sum_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_1f8.field_2._M_allocated_capacity;
    local_1f8._M_dataplus._M_p = (pointer)0x0;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_allocated_capacity = 0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      if (local_1f8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
    }
    AnalyzeBip32KeyData(local_f0,(string *)0x0,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,&this->version_
                        ,&this->depth_,&this->child_num_,local_1c0,local_1c8,(Pubkey *)0x0,
                        &this->fingerprint_);
    if (local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (fingerprint_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(fingerprint_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(privkey_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  local_1f8._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
  local_1f8._M_string_length = CONCAT44(local_1f8._M_string_length._4_4_,0x253);
  local_1f8.field_2._M_allocated_capacity = (long)"kCfdExtPrivkey" + 4;
  logger::log<int&>((CfdSourceLocation *)&local_1f8,kCfdLogLevelWarning,
                    "bip32_key_serialize error. ret={}",&ret);
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"ExtPrivkey serialize error.","");
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_1f8);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey::ExtPrivkey(
    NetType network_type, const ByteData& parent_fingerprint,
    const Privkey& privkey, const ByteData256& chain_code, uint8_t depth,
    uint32_t child_num) {
  if (!privkey.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid privkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to privkey. ExtPrivkey invalid privkey.");
  }

  // create simple parent data
  struct ext_key extkey = {};
  memset(&extkey, 0, sizeof(extkey));
  extkey.version = kVersionTestnetPrivkey;
  if ((network_type == NetType::kMainnet) ||
      (network_type == NetType::kLiquidV1)) {
    extkey.version = kVersionMainnetPrivkey;
  }
  extkey.depth = depth;
  extkey.child_num = child_num;
  Pubkey pubkey = privkey.GeneratePubkey(true);
  std::vector<uint8_t> privkey_bytes = privkey.GetData().GetBytes();
  std::vector<uint8_t> pubkey_bytes = pubkey.GetData().GetBytes();
  std::vector<uint8_t> pubkey_hash = HashUtil::Hash160(pubkey).GetBytes();
  std::vector<uint8_t> fingerprint_bytes = parent_fingerprint.GetBytes();
  std::vector<uint8_t> chain_bytes = chain_code.GetData().GetBytes();
  extkey.priv_key[0] = BIP32_FLAG_KEY_PRIVATE;
  memcpy(&extkey.priv_key[1], privkey_bytes.data(), privkey_bytes.size());
  memcpy(extkey.pub_key, pubkey_bytes.data(), pubkey_bytes.size());
  // parent160: use top 4-byte only
  fingerprint_bytes.resize(4);
  memcpy(extkey.parent160, fingerprint_bytes.data(), fingerprint_bytes.size());
  memcpy(extkey.hash160, pubkey_hash.data(), pubkey_hash.size());
  memcpy(extkey.chain_code, chain_bytes.data(), chain_bytes.size());

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  int ret = bip32_key_serialize(
      &extkey, BIP32_FLAG_KEY_PRIVATE, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }
  serialize_data_ = ByteData(data);
  tweak_sum_ = ByteData256();

  AnalyzeBip32KeyData(
      &extkey, nullptr, nullptr, &version_, &depth_, &child_num_, &chaincode_,
      &privkey_, nullptr, &fingerprint_);
}